

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

bool __thiscall
TPathFragmentTable::ComparePathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  TStruct40 *pTVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  
  pTVar1 = pSearch->pStruct40;
  if ((this->PathMarks).TotalItemCount == 0) {
    uVar4 = (ulong)(this->PathFragments).ItemCount;
    pcVar2 = (this->PathFragments).ItemArray;
    do {
      if (uVar4 <= nFragmentOffset) goto LAB_0011817a;
      if (pcVar2[nFragmentOffset] != pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      uVar5 = pTVar1->PathLength + 1;
      pTVar1->PathLength = uVar5;
      if (uVar4 <= nFragmentOffset + 1) goto LAB_0011817a;
      if (pcVar2[nFragmentOffset + 1] == '\0') {
        return true;
      }
      nFragmentOffset = nFragmentOffset + 1;
    } while ((ulong)uVar5 < pSearch->cchSearchMask);
  }
  else {
    do {
      if ((this->PathFragments).ItemCount <= nFragmentOffset) {
LAB_0011817a:
        __assert_fail("index < ItemCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                      ,0x1d0,"T &TGenericArray<char>::operator[](size_t) [T = char]");
      }
      if ((this->PathFragments).ItemArray[nFragmentOffset] !=
          pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      pTVar1->PathLength = pTVar1->PathLength + 1;
      bVar3 = TSparseArray::IsItemPresent(&this->PathMarks,nFragmentOffset);
      if (bVar3) {
        return true;
      }
      nFragmentOffset = nFragmentOffset + 1;
    } while (nFragmentOffset < pSearch->cchSearchMask);
  }
  return false;
}

Assistant:

bool ComparePathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if(PathMarks.IsEmpty())
        {
            // Keep searching as long as the name matches with the fragment
            while(PathFragments[nFragmentOffset] == pSearch->szSearchMask[pStruct40->PathLength])
            {
                // Move to the next character
                pStruct40->PathLength++;
                nFragmentOffset++;

                // Is it the end of the fragment or end of the path?
                if(PathFragments[nFragmentOffset] == 0)
                    return true;
                if(pStruct40->PathLength >= pSearch->cchSearchMask)
                    return false;
            }

            return false;
        }
        else
        {
            // Keep searching as long as the name matches with the fragment
            while(PathFragments[nFragmentOffset] == pSearch->szSearchMask[pStruct40->PathLength])
            {
                // Move to the next character
                pStruct40->PathLength++;

                // Is it the end of the path fragment?
                if(PathMarks.IsItemPresent(nFragmentOffset++))
                    return true;
                if(nFragmentOffset >= pSearch->cchSearchMask)
                    return false;
            }

            return false;
        }
    }